

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1521.cpp
# Opt level: O1

int find_kth(int x,int kth)

{
  int iVar1;
  
  if (x < maxn) {
    do {
      iVar1 = t[x * 2];
      x = (uint)(iVar1 < kth) + x * 2;
      if (kth <= iVar1) {
        iVar1 = 0;
      }
      kth = kth - iVar1;
    } while (x < maxn);
  }
  return x - maxn;
}

Assistant:

int find_kth(int x, int kth) {
    while (x < maxn){
        x *= 2;
        if (kth > t[x]) {
            kth -= t[x];
            x++;
        }
    }
    return x - maxn;
}